

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O3

void av1_fill_coeff_costs(CoeffCosts *coeff_costs,FRAME_CONTEXT *fc,int num_planes)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int *piVar8;
  int ctx_1;
  int iVar9;
  aom_cdf_prob (*paaaVar10) [2] [10];
  int (*paiVar11) [26];
  ulong uVar12;
  CoeffCosts *pCVar13;
  aom_cdf_prob (*cdf) [12];
  long lVar14;
  int *piVar15;
  ulong uVar16;
  int eob_multi_size;
  ulong uVar17;
  CoeffCosts *costs;
  aom_cdf_prob (*cdf_00) [2] [4] [4];
  aom_cdf_prob (*cdf_01) [2] [42] [5];
  aom_cdf_prob (*cdf_02) [2] [9] [3];
  aom_cdf_prob (*cdf_03) [3] [3];
  bool bVar18;
  FRAME_CONTEXT *pFVar19;
  int (*paiVar20) [26];
  bool bVar21;
  int br_rate [4];
  ulong local_f0;
  CoeffCosts *local_e0;
  int *local_d8;
  int (*local_d0) [26];
  aom_cdf_prob (*local_c8) [2] [9] [3];
  aom_cdf_prob (*local_c0) [2] [42] [5];
  aom_cdf_prob (*local_b8) [2] [4] [4];
  aom_cdf_prob (*local_b0) [2] [4] [4];
  aom_cdf_prob (*local_a8) [2] [42] [5];
  aom_cdf_prob (*local_a0) [2] [9] [3];
  aom_cdf_prob (*local_98) [3] [3];
  int (*local_90) [26];
  int local_48 [6];
  
  uVar6 = 2;
  if (num_planes < 2) {
    uVar6 = (ulong)(uint)num_planes;
  }
  uVar17 = 0;
  do {
    if (0 < num_planes) {
      uVar16 = 0;
      do {
        lVar7 = 0;
        bVar21 = true;
        do {
          bVar18 = bVar21;
          switch(uVar17 & 0xffffffff) {
          case 0:
            lVar14 = lVar7 * 3;
            paaaVar10 = (aom_cdf_prob (*) [2] [10])(fc->eob_flag_cdf16 + uVar16);
            goto LAB_0020c044;
          case 1:
            cdf = (aom_cdf_prob (*) [12])(fc->eob_flag_cdf32[uVar16] + lVar7);
            break;
          case 2:
            cdf = (aom_cdf_prob (*) [12])(fc->eob_flag_cdf64[uVar16] + lVar7);
            break;
          case 3:
            cdf = (aom_cdf_prob (*) [12])(fc->eob_flag_cdf128[uVar16] + lVar7);
            break;
          case 4:
            lVar14 = lVar7 * 5;
            paaaVar10 = fc->eob_flag_cdf256 + uVar16;
LAB_0020c044:
            cdf = (aom_cdf_prob (*) [12])((*paaaVar10)[0] + lVar14 * 2);
            break;
          case 5:
            cdf = (aom_cdf_prob (*) [12])(fc->eob_flag_cdf512[uVar16] + lVar7);
            break;
          default:
            cdf = fc->eob_flag_cdf1024[uVar16] + lVar7;
          }
          av1_cost_tokens_from_cdf
                    (coeff_costs->eob_costs[uVar17][uVar16].eob_cost[lVar7],*cdf,(int *)0x0);
          lVar7 = 1;
          bVar21 = false;
        } while (bVar18);
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar6);
    }
    uVar17 = uVar17 + 1;
    if (uVar17 == 7) {
      local_b8 = fc->coeff_base_eob_cdf;
      local_c0 = fc->coeff_base_cdf;
      local_c8 = fc->eob_extra_cdf;
      local_d0 = coeff_costs->coeff_costs[0][0].lps_cost;
      local_d8 = coeff_costs->coeff_costs[0][0].lps_cost[0] + 0xe;
      local_f0 = 0;
      pFVar19 = fc;
      local_e0 = coeff_costs;
      do {
        if (0 < num_planes) {
          uVar17 = 3;
          if ((uint)local_f0 < 3) {
            uVar17 = local_f0 & 0xffffffff;
          }
          local_90 = local_d0;
          local_a0 = local_c8;
          local_a8 = local_c0;
          local_b0 = local_b8;
          uVar16 = 0;
          pCVar13 = local_e0;
          piVar15 = local_d8;
          local_98 = fc->dc_sign_cdf;
          do {
            lVar7 = 0;
            costs = pCVar13;
            do {
              av1_cost_tokens_from_cdf
                        ((int *)costs,(aom_cdf_prob *)((long)pFVar19->txb_skip_cdf[0][0] + lVar7),
                         (int *)0x0);
              costs = (CoeffCosts *)(costs->coeff_costs[0][0].txb_skip_cost + 1);
              lVar7 = lVar7 + 6;
            } while (lVar7 != 0x4e);
            lVar7 = 0x68;
            cdf_00 = local_b0;
            do {
              av1_cost_tokens_from_cdf
                        ((int *)((long)pCVar13->coeff_costs[0][0].txb_skip_cost[0] + lVar7),
                         (aom_cdf_prob *)cdf_00,(int *)0x0);
              lVar7 = lVar7 + 0xc;
              cdf_00 = (aom_cdf_prob (*) [2] [4] [4])((*cdf_00)[0] + 1);
            } while (lVar7 != 0x98);
            lVar7 = 0x98;
            cdf_01 = local_a8;
            do {
              av1_cost_tokens_from_cdf
                        ((int *)((long)pCVar13->coeff_costs[0][0].txb_skip_cost[0] + lVar7),
                         (aom_cdf_prob *)cdf_01,(int *)0x0);
              lVar7 = lVar7 + 0x20;
              cdf_01 = (aom_cdf_prob (*) [2] [42] [5])((*cdf_01)[0] + 1);
            } while (lVar7 != 0x5d8);
            lVar7 = 0xb4;
            do {
              *(undefined4 *)((long)(pCVar13->coeff_costs + -1) + 0x1d74 + lVar7) = 0;
              iVar9 = *(int *)((long)(pCVar13->coeff_costs + -1) + 0x1d68 + lVar7);
              iVar3 = *(int *)((long)(pCVar13->coeff_costs + -1) + 0x1d6c + lVar7);
              *(int *)((long)(pCVar13->coeff_costs + -1) + 0x1d78 + lVar7) =
                   (iVar9 - *(int *)((long)(pCVar13->coeff_costs + -1) + 0x1d64 + lVar7)) + 0x200;
              *(int *)((long)(pCVar13->coeff_costs + -1) + 0x1d7c + lVar7) = iVar3 - iVar9;
              *(int *)((long)pCVar13->coeff_costs[0][0].txb_skip_cost[0] + lVar7) =
                   *(int *)((long)(pCVar13->coeff_costs + -1) + 0x1d70 + lVar7) - iVar3;
              lVar7 = lVar7 + 0x20;
            } while (lVar7 != 0x5f4);
            lVar7 = 0x5d8;
            cdf_02 = local_a0;
            do {
              av1_cost_tokens_from_cdf
                        ((int *)((long)pCVar13->coeff_costs[0][0].txb_skip_cost[0] + lVar7),
                         (aom_cdf_prob *)cdf_02,(int *)0x0);
              lVar7 = lVar7 + 8;
              cdf_02 = (aom_cdf_prob (*) [2] [9] [3])((*cdf_02)[0] + 1);
            } while (lVar7 != 0x620);
            lVar7 = 0x620;
            cdf_03 = local_98;
            do {
              av1_cost_tokens_from_cdf
                        ((int *)((long)pCVar13->coeff_costs[0][0].txb_skip_cost[0] + lVar7),
                         (aom_cdf_prob *)cdf_03,(int *)0x0);
              lVar7 = lVar7 + 8;
              cdf_03 = (aom_cdf_prob (*) [3] [3])(*cdf_03 + 1);
            } while (lVar7 != 0x638);
            lVar7 = 0;
            paiVar20 = local_90;
            do {
              av1_cost_tokens_from_cdf(local_48,fc->coeff_br_cdf[uVar17][uVar16][lVar7],(int *)0x0);
              iVar9 = 0;
              paiVar11 = paiVar20;
              uVar12 = 0;
              do {
                lVar14 = 0;
                do {
                  (*paiVar11)[lVar14] = local_48[lVar14] + iVar9;
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                iVar9 = iVar9 + local_48[3];
                paiVar11 = (int (*) [26])(*paiVar11 + 3);
                bVar21 = uVar12 < 9;
                uVar12 = uVar12 + 3;
              } while (bVar21);
              coeff_costs->coeff_costs[local_f0][uVar16].lps_cost[lVar7][0xc] = iVar9;
              lVar7 = lVar7 + 1;
              paiVar20 = paiVar20 + 1;
            } while (lVar7 != 0x15);
            lVar7 = 0;
            piVar8 = piVar15;
            do {
              iVar9 = coeff_costs->coeff_costs[local_f0][uVar16].lps_cost[lVar7][0];
              coeff_costs->coeff_costs[local_f0][uVar16].lps_cost[lVar7][0xd] = iVar9;
              lVar14 = -0xc;
              do {
                piVar1 = piVar8 + lVar14 + -1;
                iVar3 = piVar1[1];
                iVar4 = piVar1[2];
                iVar5 = piVar1[3];
                piVar2 = piVar8 + lVar14 + 0xc;
                *piVar2 = *piVar1 - iVar9;
                piVar2[1] = iVar3 - *piVar1;
                piVar2[2] = iVar4 - iVar3;
                piVar2[3] = iVar5 - iVar4;
                lVar14 = lVar14 + 4;
                iVar9 = iVar5;
              } while (lVar14 != 0);
              lVar7 = lVar7 + 1;
              piVar8 = piVar8 + 0x1a;
            } while (lVar7 != 0x15);
            uVar16 = uVar16 + 1;
            pCVar13 = (CoeffCosts *)(pCVar13->coeff_costs[0] + 1);
            local_b0 = (aom_cdf_prob (*) [2] [4] [4])(*local_b0 + 1);
            local_a8 = (aom_cdf_prob (*) [2] [42] [5])(*local_a8 + 1);
            local_a0 = (aom_cdf_prob (*) [2] [9] [3])(*local_a0 + 1);
            local_98 = local_98 + 1;
            local_90 = (int (*) [26])((long)(local_90 + 0x24) + 0x20);
            piVar15 = piVar15 + 0x3b0;
          } while (uVar16 != uVar6);
        }
        local_f0 = local_f0 + 1;
        local_e0 = (CoeffCosts *)(local_e0->coeff_costs + 1);
        pFVar19 = (FRAME_CONTEXT *)(pFVar19->txb_skip_cdf + 1);
        local_b8 = local_b8 + 1;
        local_c0 = local_c0 + 1;
        local_c8 = local_c8 + 1;
        local_d0 = (int (*) [26])((long)(local_d0 + 0x48) + 0x40);
        local_d8 = local_d8 + 0x760;
      } while (local_f0 != 5);
      return;
    }
  } while( true );
}

Assistant:

void av1_fill_coeff_costs(CoeffCosts *coeff_costs, FRAME_CONTEXT *fc,
                          const int num_planes) {
  const int nplanes = AOMMIN(num_planes, PLANE_TYPES);
  for (int eob_multi_size = 0; eob_multi_size < 7; ++eob_multi_size) {
    for (int plane = 0; plane < nplanes; ++plane) {
      LV_MAP_EOB_COST *pcost = &coeff_costs->eob_costs[eob_multi_size][plane];

      for (int ctx = 0; ctx < 2; ++ctx) {
        aom_cdf_prob *pcdf;
        switch (eob_multi_size) {
          case 0: pcdf = fc->eob_flag_cdf16[plane][ctx]; break;
          case 1: pcdf = fc->eob_flag_cdf32[plane][ctx]; break;
          case 2: pcdf = fc->eob_flag_cdf64[plane][ctx]; break;
          case 3: pcdf = fc->eob_flag_cdf128[plane][ctx]; break;
          case 4: pcdf = fc->eob_flag_cdf256[plane][ctx]; break;
          case 5: pcdf = fc->eob_flag_cdf512[plane][ctx]; break;
          case 6:
          default: pcdf = fc->eob_flag_cdf1024[plane][ctx]; break;
        }
        av1_cost_tokens_from_cdf(pcost->eob_cost[ctx], pcdf, NULL);
      }
    }
  }
  for (int tx_size = 0; tx_size < TX_SIZES; ++tx_size) {
    for (int plane = 0; plane < nplanes; ++plane) {
      LV_MAP_COEFF_COST *pcost = &coeff_costs->coeff_costs[tx_size][plane];

      for (int ctx = 0; ctx < TXB_SKIP_CONTEXTS; ++ctx)
        av1_cost_tokens_from_cdf(pcost->txb_skip_cost[ctx],
                                 fc->txb_skip_cdf[tx_size][ctx], NULL);

      for (int ctx = 0; ctx < SIG_COEF_CONTEXTS_EOB; ++ctx)
        av1_cost_tokens_from_cdf(pcost->base_eob_cost[ctx],
                                 fc->coeff_base_eob_cdf[tx_size][plane][ctx],
                                 NULL);
      for (int ctx = 0; ctx < SIG_COEF_CONTEXTS; ++ctx)
        av1_cost_tokens_from_cdf(pcost->base_cost[ctx],
                                 fc->coeff_base_cdf[tx_size][plane][ctx], NULL);

      for (int ctx = 0; ctx < SIG_COEF_CONTEXTS; ++ctx) {
        pcost->base_cost[ctx][4] = 0;
        pcost->base_cost[ctx][5] = pcost->base_cost[ctx][1] +
                                   av1_cost_literal(1) -
                                   pcost->base_cost[ctx][0];
        pcost->base_cost[ctx][6] =
            pcost->base_cost[ctx][2] - pcost->base_cost[ctx][1];
        pcost->base_cost[ctx][7] =
            pcost->base_cost[ctx][3] - pcost->base_cost[ctx][2];
      }

      for (int ctx = 0; ctx < EOB_COEF_CONTEXTS; ++ctx)
        av1_cost_tokens_from_cdf(pcost->eob_extra_cost[ctx],
                                 fc->eob_extra_cdf[tx_size][plane][ctx], NULL);

      for (int ctx = 0; ctx < DC_SIGN_CONTEXTS; ++ctx)
        av1_cost_tokens_from_cdf(pcost->dc_sign_cost[ctx],
                                 fc->dc_sign_cdf[plane][ctx], NULL);

      for (int ctx = 0; ctx < LEVEL_CONTEXTS; ++ctx) {
        int br_rate[BR_CDF_SIZE];
        int prev_cost = 0;
        int i, j;
        av1_cost_tokens_from_cdf(
            br_rate, fc->coeff_br_cdf[AOMMIN(tx_size, TX_32X32)][plane][ctx],
            NULL);
        for (i = 0; i < COEFF_BASE_RANGE; i += BR_CDF_SIZE - 1) {
          for (j = 0; j < BR_CDF_SIZE - 1; j++) {
            pcost->lps_cost[ctx][i + j] = prev_cost + br_rate[j];
          }
          prev_cost += br_rate[j];
        }
        pcost->lps_cost[ctx][i] = prev_cost;
      }
      for (int ctx = 0; ctx < LEVEL_CONTEXTS; ++ctx) {
        pcost->lps_cost[ctx][0 + COEFF_BASE_RANGE + 1] =
            pcost->lps_cost[ctx][0];
        for (int i = 1; i <= COEFF_BASE_RANGE; ++i) {
          pcost->lps_cost[ctx][i + COEFF_BASE_RANGE + 1] =
              pcost->lps_cost[ctx][i] - pcost->lps_cost[ctx][i - 1];
        }
      }
    }
  }
}